

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.hpp
# Opt level: O2

bool __thiscall
xercesc_4_0::DatatypeValidator::isSubstitutableBy
          (DatatypeValidator *this,DatatypeValidator *toCheck)

{
  for (; (toCheck != this && (toCheck != (DatatypeValidator *)0x0));
      toCheck = toCheck->fBaseValidator) {
  }
  return toCheck != (DatatypeValidator *)0x0;
}

Assistant:

inline bool
DatatypeValidator::isSubstitutableBy(const DatatypeValidator* const toCheck)
{
    const DatatypeValidator* dv = toCheck;

	while (dv != 0) {

        if (dv == this) {
            return true;
        }

        dv = dv->getBaseValidator();
    }

    return false;
}